

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O2

void __thiscall
level_tools::push_subdivisions_v5
          (level_tools *this,level_mesh *mesh,uint16_t sector_idx,uint32_t ogf_idx)

{
  uint16_t texture;
  value_type pxVar1;
  uint32_t *puVar2;
  bool bVar3;
  int iVar4;
  uint32_t eshader_idx;
  int iVar5;
  uint uVar6;
  const_reference ppxVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint32_t *puVar8;
  
  ppxVar7 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::at
                      (this->m_subdivisions,(ulong)ogf_idx);
  pxVar1 = *ppxVar7;
  iVar4 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x16])
                    (pxVar1);
  if ((char)iVar4 == '\0') {
    eshader_idx = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                    [0x1e])(pxVar1);
    bVar3 = is_compiled_wallmark(this,eshader_idx);
    if (!bVar3) {
      iVar4 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])
                        (pxVar1);
      iVar5 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x20])
                        (pxVar1);
      uVar6 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1d])
                        (pxVar1);
      texture = (this->m_uniq_textures).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
      uVar6 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1e])
                        (pxVar1);
      level_mesh::push(mesh,sector_idx,(xr_vbuf *)CONCAT44(extraout_var,iVar4),
                       (xr_ibuf *)CONCAT44(extraout_var_00,iVar5),texture,
                       (this->m_uniq_shaders).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar6]);
      return;
    }
  }
  else {
    puVar2 = (pxVar1->m_children_l).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (puVar8 = (pxVar1->m_children_l).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
      push_subdivisions_v5(this,mesh,sector_idx,*puVar8);
    }
  }
  return;
}

Assistant:

void level_tools::push_subdivisions_v5(level_mesh* mesh, uint16_t sector_idx, uint32_t ogf_idx)
{
	xr_ogf_v3* ogf = static_cast<xr_ogf_v3*>(m_subdivisions->at(ogf_idx));
	if (ogf->hierarchical()) {
		for (std::vector<uint32_t>::const_iterator it = ogf->children_l().begin(),
				end = ogf->children_l().end(); it != end; ++it) {
			push_subdivisions_v5(mesh, sector_idx, *it);
		}
	} else if (is_compiled_wallmark(ogf->shader_l())) {
		;
	} else {
		mesh->push(sector_idx, ogf->vb(), ogf->ib(),
				m_uniq_textures[ogf->texture_l()],
				m_uniq_shaders[ogf->shader_l()]);
	}
}